

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O0

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deInt16 value)

{
  undefined1 local_16;
  undefined1 local_15;
  ushort local_14;
  deInt16 local_12;
  deUint8 data [2];
  deInt16 val;
  SeedBuilder *pSStack_10;
  deInt16 value_local;
  SeedBuilder *builder_local;
  
  local_14 = value ^ 0x22b;
  local_16 = (undefined1)local_14;
  local_15 = (undefined1)(local_14 >> 8);
  local_12 = value;
  pSStack_10 = builder;
  SeedBuilder::feed(builder,2,&local_16);
  return pSStack_10;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deInt16 value)
{
	const deInt16	val		= value ^ 555;
	const deUint8	data[]	=
	{
		(deUint8)(((deUint16)val) & 0xFFu),
		(deUint8)(((deUint16)val) >> 8),
	};

	builder.feed(sizeof(data), data);
	return builder;
}